

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 pstore::to_base64<unsigned_char_const*,std::back_insert_iterator<std::__cxx11::string>>
           (uchar *first,uchar *last,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  
  lVar1 = (long)last - (long)first;
  lVar4 = lVar1 / 3;
  lVar2 = lVar1 % 3;
  cVar3 = (char)out.container;
  if (2 < lVar1) {
    do {
      first = first + 3;
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (lVar2 != 0) {
    if (lVar2 == 1) {
      first = first + 1;
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
    }
    else {
      if (lVar2 != 2) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                      ,0x4e);
      }
      first = first + 2;
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
  }
  if (first != last) {
    assert_failed("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                  ,0x51);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIterator to_base64 (ForwardIterator first, ForwardIterator last, OutputIterator out) {
        static constexpr std::array<char, 64> alphabet{
            {'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', 'P',
             'Q', 'R', 'S', 'T', 'U', 'V', 'W', 'X', 'Y', 'Z', 'a', 'b', 'c', 'd', 'e', 'f',
             'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r', 's', 't', 'u', 'v',
             'w', 'x', 'y', 'z', '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', '+', '/'}};
        auto const size = std::distance (first, last);
        // Consume the input, converting three input bytes to four output characters.
        for (auto index = decltype (size){0}; index < size / 3; ++index) {
            auto value1 = static_cast<std::uint32_t> (*(first++) << 16);
            value1 += static_cast<std::uint32_t> (*(first++) << 8);
            value1 += static_cast<std::uint32_t> (*(first++));

            *(out++) = alphabet[(value1 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value1 & 0x0003F000) >> 12];
            *(out++) = alphabet[(value1 & 0x00000FC0) >> 6];
            *(out++) = alphabet[value1 & 0x0000003F];
        }

        // Deal with the remaining 0..2 characters.
        switch (size % 3) {
        case 0: break;
        case 1: {
            auto const value2 = static_cast<std::uint32_t> (*(first++) << 16);

            *(out++) = alphabet[(value2 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value2 & 0x0003F000) >> 12];
            *(out++) = '=';
            *(out++) = '=';
        } break;
        case 2: {
            auto value3 = static_cast<std::uint32_t> (*(first++) << 16);
            value3 += static_cast<std::uint32_t> (*(first++) << 8);

            *(out++) = alphabet[(value3 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value3 & 0x0003F000) >> 12];
            *(out++) = alphabet[(value3 & 0x00000FC0) >> 6];
            *(out++) = '=';
        } break;
        default:
            PSTORE_ASSERT (false); //! OCLINT(PH - don't warn about a conditional constant)
            break;
        }
        PSTORE_ASSERT (first == last);
        return out;
    }